

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O1

int tlstran_listener_set(void *arg,char *name,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  nng_stream_listener *l;
  
  if (arg == (void *)0x0) {
    l = (nng_stream_listener *)0x0;
  }
  else {
    l = *(nng_stream_listener **)((long)arg + 0x60);
  }
  iVar1 = nni_stream_listener_set(l,name,buf,sz,t);
  if (iVar1 == 9) {
    iVar1 = nni_setopt(tlstran_ep_options,name,arg,buf,sz,t);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int
tlstran_listener_set(
    void *arg, const char *name, const void *buf, size_t sz, nni_type t)
{
	int         rv;
	tlstran_ep *ep = arg;

	rv = nni_stream_listener_set(
	    ep != NULL ? ep->listener : NULL, name, buf, sz, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_setopt(tlstran_ep_options, name, ep, buf, sz, t);
	}
	return (rv);
}